

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall TestDateTime::testDateTime(TestDateTime *this)

{
  int iVar1;
  Type *pTVar2;
  long lVar3;
  bool bVar4;
  char cVar5;
  QTime QVar6;
  QDate QVar7;
  undefined8 uVar8;
  int iVar9;
  int iVar10;
  QPoint pos;
  QPoint pos_00;
  QPoint pos_01;
  QPoint pos_02;
  QPoint pos_03;
  QPoint pos_04;
  QPoint pos_05;
  QPoint pos_06;
  QPoint pos_07;
  QPoint pos_08;
  QPoint pos_09;
  QPoint pos_10;
  int iVar11;
  undefined1 local_158 [16];
  qsizetype local_148;
  double local_138;
  QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
  local_130;
  double local_128;
  double local_120;
  undefined8 local_118;
  QMouseEvent me;
  QDateTime dt;
  QTime local_b4;
  QTime local_b0;
  QTime local_ac;
  QTime local_a8;
  QTime local_a4;
  QTime local_a0;
  QTime local_9c;
  QTime local_98;
  QTime local_94;
  QTime local_90;
  QTime local_8c;
  QDate local_88;
  QDate local_80;
  QDate local_78;
  QDate local_70;
  QDate local_68;
  QDate local_60;
  QDate local_58;
  QDate local_50;
  QDate local_48;
  QDate local_40;
  QDate local_38;
  QTime local_2c;
  QDate local_28;
  
  QWidget::show();
  bVar4 = (bool)QTest::qWaitForWindowActive(&((this->m_dt).value)->super_QWidget,5000);
  cVar5 = QTest::qVerify(bVar4,"QTest::qWaitForWindowActive( m_dt.data() )","",
                         "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                         ,0x98);
  if (cVar5 != '\0') {
    QtMWidgets::DateTimePicker::dateTime((DateTimePicker *)&me);
    QDate::QDate(&local_38,2000,1,1);
    QTime::QTime(&local_8c,0,0,0,0);
    QDateTime::QDateTime((QDateTime *)local_158,local_38,local_8c,LocalTime,0);
    bVar4 = (bool)QDateTime::equals((QDateTime *)&me);
    cVar5 = QTest::qVerify(bVar4,
                           "m_dt->dateTime() == QDateTime( DATETIMEPICKER_DATE_INITIAL, DATETIMEPICKER_TIME_MIN )"
                           ,"",
                           "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                           ,0x9b);
    QDateTime::~QDateTime((QDateTime *)local_158);
    QDateTime::~QDateTime((QDateTime *)&me);
    if (cVar5 != '\0') {
      QDate::QDate(&local_28,0x7e4,10,0x18);
      QTime::QTime(&local_2c,0xd,0xc,0,0);
      QDateTime::QDateTime(&dt,local_28,local_2c,LocalTime,0);
      QtMWidgets::DateTimePicker::setDateTime((this->m_dt).value,&dt);
      QVar7 = QtMWidgets::DateTimePicker::minimumDate((this->m_dt).value);
      QDate::QDate(&local_40,0x6d8,9,0xe);
      cVar5 = QTest::qVerify(QVar7.jd == local_40.jd,
                             "m_dt->minimumDate() == DATETIMEPICKER_COMPAT_DATE_MIN","",
                             "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                             ,0xa0);
      if (cVar5 != '\0') {
        QVar7 = QtMWidgets::DateTimePicker::maximumDate((this->m_dt).value);
        QDate::QDate(&local_48,7999,0xc,0x1f);
        cVar5 = QTest::qVerify(QVar7.jd == local_48.jd,
                               "m_dt->maximumDate() == DATETIMEPICKER_DATE_MAX","",
                               "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                               ,0xa1);
        if (cVar5 != '\0') {
          QVar6 = QtMWidgets::DateTimePicker::minimumTime((this->m_dt).value);
          QTime::QTime(&local_90,0,0,0,0);
          cVar5 = QTest::qVerify(QVar6.mds == local_90.mds,
                                 "m_dt->minimumTime() == DATETIMEPICKER_TIME_MIN","",
                                 "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                                 ,0xa2);
          if (cVar5 != '\0') {
            QVar6 = QtMWidgets::DateTimePicker::maximumTime((this->m_dt).value);
            QTime::QTime(&local_94,0x17,0x3b,0x3b,999);
            cVar5 = QTest::qVerify(QVar6.mds == local_94.mds,
                                   "m_dt->maximumTime() == DATETIMEPICKER_TIME_MAX","",
                                   "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                                   ,0xa3);
            if (cVar5 != '\0') {
              QtMWidgets::DateTimePicker::minimumDateTime((DateTimePicker *)&me);
              QDate::QDate(&local_50,0x6d8,9,0xe);
              QTime::QTime(&local_98,0,0,0,0);
              QDateTime::QDateTime((QDateTime *)local_158,local_50,local_98,LocalTime,0);
              bVar4 = (bool)QDateTime::equals((QDateTime *)&me);
              cVar5 = QTest::qVerify(bVar4,
                                     "m_dt->minimumDateTime() == DATETIMEPICKER_COMPAT_DATETIME_MIN"
                                     ,"",
                                     "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                                     ,0xa4);
              QDateTime::~QDateTime((QDateTime *)local_158);
              QDateTime::~QDateTime((QDateTime *)&me);
              if (cVar5 != '\0') {
                QtMWidgets::DateTimePicker::maximumDateTime((DateTimePicker *)&me);
                QDate::QDate(&local_58,7999,0xc,0x1f);
                QTime::QTime(&local_9c,0x17,0x3b,0x3b,999);
                QDateTime::QDateTime((QDateTime *)local_158,local_58,local_9c,LocalTime,0);
                bVar4 = (bool)QDateTime::equals((QDateTime *)&me);
                cVar5 = QTest::qVerify(bVar4,
                                       "m_dt->maximumDateTime() == DATETIMEPICKER_DATETIME_MAX","",
                                       "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                                       ,0xa5);
                QDateTime::~QDateTime((QDateTime *)local_158);
                QDateTime::~QDateTime((QDateTime *)&me);
                if (cVar5 != '\0') {
                  QtMWidgets::DateTimePicker::dateTime((DateTimePicker *)&me);
                  bVar4 = (bool)QDateTime::equals((QDateTime *)&me);
                  cVar5 = QTest::qVerify(bVar4,"m_dt->dateTime() == dt","",
                                         "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                                         ,0xa7);
                  QDateTime::~QDateTime((QDateTime *)&me);
                  if (cVar5 != '\0') {
                    QWidget::update();
                    QTest::qWait(500);
                    pTVar2 = (this->m_dt).value;
                    iVar1 = *(this->m_dtSections).d.ptr;
                    lVar3 = *(long *)&pTVar2->field_0x20;
                    iVar9 = *(int *)(lVar3 + 0x20) - *(int *)(lVar3 + 0x18);
                    iVar11 = (iVar9 - (iVar9 + 1 >> 0x1f)) + 1 >> 1;
                    pos.yp = iVar11;
                    pos.xp = iVar1;
                    QTest::mouseEvent(MousePress,&pTVar2->super_QWidget,LeftButton,
                                      (KeyboardModifiers)0x0,pos,0x14);
                    iVar9 = (this->m_delta).xp + iVar1;
                    iVar10 = (this->m_delta).yp + iVar11;
                    local_138 = (double)iVar9;
                    local_130.d = (DateTimePickerPrivate *)(double)iVar10;
                    local_118 = CONCAT44(iVar10,iVar9);
                    uVar8 = QWidget::mapToGlobal((QPoint *)(this->m_dt).value);
                    local_128 = (double)(int)uVar8;
                    local_120 = (double)(int)((ulong)uVar8 >> 0x20);
                    local_158._0_8_ = (QArrayData *)0x0;
                    local_158._8_8_ = (char16_t *)0x0;
                    local_148 = 0;
                    uVar8 = QPointingDevice::primaryPointingDevice((QString *)local_158);
                    QMouseEvent::QMouseEvent(&me,5,&local_138,&local_128,1,1,0,uVar8);
                    if ((QArrayData *)local_158._0_8_ != (QArrayData *)0x0) {
                      LOCK();
                      (((QBasicAtomicInt *)local_158._0_8_)->_q_value).super___atomic_base<int>._M_i
                           = (((QBasicAtomicInt *)local_158._0_8_)->_q_value).
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if ((((QBasicAtomicInt *)local_158._0_8_)->_q_value).super___atomic_base<int>.
                          _M_i == 0) {
                        QArrayData::deallocate((QArrayData *)local_158._0_8_,2,8);
                      }
                    }
                    QCoreApplication::sendEvent((QObject *)(this->m_dt).value,(QEvent *)&me);
                    QTest::qWait(500);
                    pos_05.xp = iVar1 + (this->m_delta).xp;
                    pos_05.yp = iVar11 + (this->m_delta).yp;
                    QTest::mouseEvent(MouseRelease,&((this->m_dt).value)->super_QWidget,LeftButton,
                                      (KeyboardModifiers)0x0,pos_05,0x14);
                    QTest::qWait(500);
                    QtMWidgets::DateTimePicker::dateTime((DateTimePicker *)local_158);
                    QDate::QDate(&local_60,0x7e4,10,0x19);
                    QTime::QTime(&local_a0,0xd,0xc,0,0);
                    QDateTime::QDateTime((QDateTime *)&local_138,local_60,local_a0,LocalTime,0);
                    bVar4 = (bool)QDateTime::equals((QDateTime *)local_158);
                    cVar5 = QTest::qVerify(bVar4,
                                           "m_dt->dateTime() == QDateTime( { 2020, 10, 25 }, { 13, 12 } )"
                                           ,"",
                                           "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                                           ,0xb8);
                    QDateTime::~QDateTime((QDateTime *)&local_138);
                    QDateTime::~QDateTime((QDateTime *)local_158);
                    QMouseEvent::~QMouseEvent(&me);
                    if (cVar5 != '\0') {
                      pTVar2 = (this->m_dt).value;
                      iVar1 = (this->m_dtSections).d.ptr[1];
                      lVar3 = *(long *)&pTVar2->field_0x20;
                      iVar9 = *(int *)(lVar3 + 0x20) - *(int *)(lVar3 + 0x18);
                      iVar11 = (iVar9 - (iVar9 + 1 >> 0x1f)) + 1 >> 1;
                      pos_00.yp = iVar11;
                      pos_00.xp = iVar1;
                      QTest::mouseEvent(MousePress,&pTVar2->super_QWidget,LeftButton,
                                        (KeyboardModifiers)0x0,pos_00,0x14);
                      iVar9 = (this->m_delta).xp + iVar1;
                      iVar10 = (this->m_delta).yp + iVar11;
                      local_138 = (double)iVar9;
                      local_130.d = (DateTimePickerPrivate *)(double)iVar10;
                      local_118 = CONCAT44(iVar10,iVar9);
                      uVar8 = QWidget::mapToGlobal((QPoint *)(this->m_dt).value);
                      local_128 = (double)(int)uVar8;
                      local_120 = (double)(int)((ulong)uVar8 >> 0x20);
                      local_158._0_8_ = (QArrayData *)0x0;
                      local_158._8_8_ = (char16_t *)0x0;
                      local_148 = 0;
                      uVar8 = QPointingDevice::primaryPointingDevice((QString *)local_158);
                      QMouseEvent::QMouseEvent(&me,5,&local_138,&local_128,1,1,0,uVar8);
                      if ((QArrayData *)local_158._0_8_ != (QArrayData *)0x0) {
                        LOCK();
                        (((QBasicAtomicInt *)local_158._0_8_)->_q_value).super___atomic_base<int>.
                        _M_i = (((QBasicAtomicInt *)local_158._0_8_)->_q_value).
                               super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if ((((QBasicAtomicInt *)local_158._0_8_)->_q_value).
                            super___atomic_base<int>._M_i == 0) {
                          QArrayData::deallocate((QArrayData *)local_158._0_8_,2,8);
                        }
                      }
                      QCoreApplication::sendEvent((QObject *)(this->m_dt).value,(QEvent *)&me);
                      QTest::qWait(500);
                      pos_06.xp = iVar1 + (this->m_delta).xp;
                      pos_06.yp = iVar11 + (this->m_delta).yp;
                      QTest::mouseEvent(MouseRelease,&((this->m_dt).value)->super_QWidget,LeftButton
                                        ,(KeyboardModifiers)0x0,pos_06,0x14);
                      QTest::qWait(500);
                      QtMWidgets::DateTimePicker::dateTime((DateTimePicker *)local_158);
                      QDate::QDate(&local_68,0x7e4,0xb,0x19);
                      QTime::QTime(&local_a4,0xd,0xc,0,0);
                      QDateTime::QDateTime((QDateTime *)&local_138,local_68,local_a4,LocalTime,0);
                      bVar4 = (bool)QDateTime::equals((QDateTime *)local_158);
                      cVar5 = QTest::qVerify(bVar4,
                                             "m_dt->dateTime() == QDateTime( { 2020, 11, 25 }, { 13, 12 } )"
                                             ,"",
                                             "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                                             ,0xc6);
                      QDateTime::~QDateTime((QDateTime *)&local_138);
                      QDateTime::~QDateTime((QDateTime *)local_158);
                      QMouseEvent::~QMouseEvent(&me);
                      if (cVar5 != '\0') {
                        pTVar2 = (this->m_dt).value;
                        iVar1 = (this->m_dtSections).d.ptr[2];
                        lVar3 = *(long *)&pTVar2->field_0x20;
                        iVar9 = *(int *)(lVar3 + 0x20) - *(int *)(lVar3 + 0x18);
                        iVar11 = (iVar9 - (iVar9 + 1 >> 0x1f)) + 1 >> 1;
                        pos_01.yp = iVar11;
                        pos_01.xp = iVar1;
                        QTest::mouseEvent(MousePress,&pTVar2->super_QWidget,LeftButton,
                                          (KeyboardModifiers)0x0,pos_01,0x14);
                        iVar9 = (this->m_delta).xp + iVar1;
                        iVar10 = (this->m_delta).yp + iVar11;
                        local_138 = (double)iVar9;
                        local_130.d = (DateTimePickerPrivate *)(double)iVar10;
                        local_118 = CONCAT44(iVar10,iVar9);
                        uVar8 = QWidget::mapToGlobal((QPoint *)(this->m_dt).value);
                        local_128 = (double)(int)uVar8;
                        local_120 = (double)(int)((ulong)uVar8 >> 0x20);
                        local_158._0_8_ = (QArrayData *)0x0;
                        local_158._8_8_ = (char16_t *)0x0;
                        local_148 = 0;
                        uVar8 = QPointingDevice::primaryPointingDevice((QString *)local_158);
                        QMouseEvent::QMouseEvent(&me,5,&local_138,&local_128,1,1,0,uVar8);
                        if ((QArrayData *)local_158._0_8_ != (QArrayData *)0x0) {
                          LOCK();
                          (((QBasicAtomicInt *)local_158._0_8_)->_q_value).super___atomic_base<int>.
                          _M_i = (((QBasicAtomicInt *)local_158._0_8_)->_q_value).
                                 super___atomic_base<int>._M_i + -1;
                          UNLOCK();
                          if ((((QBasicAtomicInt *)local_158._0_8_)->_q_value).
                              super___atomic_base<int>._M_i == 0) {
                            QArrayData::deallocate((QArrayData *)local_158._0_8_,2,8);
                          }
                        }
                        QCoreApplication::sendEvent((QObject *)(this->m_dt).value,(QEvent *)&me);
                        QTest::qWait(500);
                        pos_07.xp = iVar1 + (this->m_delta).xp;
                        pos_07.yp = iVar11 + (this->m_delta).yp;
                        QTest::mouseEvent(MouseRelease,&((this->m_dt).value)->super_QWidget,
                                          LeftButton,(KeyboardModifiers)0x0,pos_07,0x14);
                        QTest::qWait(500);
                        QtMWidgets::DateTimePicker::dateTime((DateTimePicker *)local_158);
                        QDate::QDate(&local_70,0x7e5,0xb,0x19);
                        QTime::QTime(&local_a8,0xd,0xc,0,0);
                        QDateTime::QDateTime((QDateTime *)&local_138,local_70,local_a8,LocalTime,0);
                        bVar4 = (bool)QDateTime::equals((QDateTime *)local_158);
                        cVar5 = QTest::qVerify(bVar4,
                                               "m_dt->dateTime() == QDateTime( { 2021, 11, 25 }, { 13, 12 } )"
                                               ,"",
                                               "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                                               ,0xd5);
                        QDateTime::~QDateTime((QDateTime *)&local_138);
                        QDateTime::~QDateTime((QDateTime *)local_158);
                        QMouseEvent::~QMouseEvent(&me);
                        if (cVar5 != '\0') {
                          pTVar2 = (this->m_dt).value;
                          iVar1 = (this->m_dtSections).d.ptr[3];
                          lVar3 = *(long *)&pTVar2->field_0x20;
                          iVar9 = *(int *)(lVar3 + 0x20) - *(int *)(lVar3 + 0x18);
                          iVar11 = (iVar9 - (iVar9 + 1 >> 0x1f)) + 1 >> 1;
                          pos_02.yp = iVar11;
                          pos_02.xp = iVar1;
                          QTest::mouseEvent(MousePress,&pTVar2->super_QWidget,LeftButton,
                                            (KeyboardModifiers)0x0,pos_02,0x14);
                          iVar9 = (this->m_delta).xp + iVar1;
                          iVar10 = (this->m_delta).yp + iVar11;
                          local_138 = (double)iVar9;
                          local_130.d = (DateTimePickerPrivate *)(double)iVar10;
                          local_118 = CONCAT44(iVar10,iVar9);
                          uVar8 = QWidget::mapToGlobal((QPoint *)(this->m_dt).value);
                          local_128 = (double)(int)uVar8;
                          local_120 = (double)(int)((ulong)uVar8 >> 0x20);
                          local_158._0_8_ = (QArrayData *)0x0;
                          local_158._8_8_ = (char16_t *)0x0;
                          local_148 = 0;
                          uVar8 = QPointingDevice::primaryPointingDevice((QString *)local_158);
                          QMouseEvent::QMouseEvent(&me,5,&local_138,&local_128,1,1,0,uVar8);
                          if ((QArrayData *)local_158._0_8_ != (QArrayData *)0x0) {
                            LOCK();
                            (((QBasicAtomicInt *)local_158._0_8_)->_q_value).
                            super___atomic_base<int>._M_i =
                                 (((QBasicAtomicInt *)local_158._0_8_)->_q_value).
                                 super___atomic_base<int>._M_i + -1;
                            UNLOCK();
                            if ((((QBasicAtomicInt *)local_158._0_8_)->_q_value).
                                super___atomic_base<int>._M_i == 0) {
                              QArrayData::deallocate((QArrayData *)local_158._0_8_,2,8);
                            }
                          }
                          QCoreApplication::sendEvent((QObject *)(this->m_dt).value,(QEvent *)&me);
                          QTest::qWait(500);
                          pos_08.xp = iVar1 + (this->m_delta).xp;
                          pos_08.yp = iVar11 + (this->m_delta).yp;
                          QTest::mouseEvent(MouseRelease,&((this->m_dt).value)->super_QWidget,
                                            LeftButton,(KeyboardModifiers)0x0,pos_08,0x14);
                          QTest::qWait(500);
                          QtMWidgets::DateTimePicker::dateTime((DateTimePicker *)local_158);
                          QDate::QDate(&local_78,0x7e5,0xb,0x19);
                          QTime::QTime(&local_ac,0xe,0xc,0,0);
                          QDateTime::QDateTime
                                    ((QDateTime *)&local_138,local_78,local_ac,LocalTime,0);
                          bVar4 = (bool)QDateTime::equals((QDateTime *)local_158);
                          cVar5 = QTest::qVerify(bVar4,
                                                 "m_dt->dateTime() == QDateTime( { 2021, 11, 25 }, { 14, 12 } )"
                                                 ,"",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                                                 ,0xe4);
                          QDateTime::~QDateTime((QDateTime *)&local_138);
                          QDateTime::~QDateTime((QDateTime *)local_158);
                          QMouseEvent::~QMouseEvent(&me);
                          if (cVar5 != '\0') {
                            pTVar2 = (this->m_dt).value;
                            iVar1 = (this->m_dtSections).d.ptr[4];
                            lVar3 = *(long *)&pTVar2->field_0x20;
                            iVar9 = *(int *)(lVar3 + 0x20) - *(int *)(lVar3 + 0x18);
                            iVar11 = (iVar9 - (iVar9 + 1 >> 0x1f)) + 1 >> 1;
                            pos_03.yp = iVar11;
                            pos_03.xp = iVar1;
                            QTest::mouseEvent(MousePress,&pTVar2->super_QWidget,LeftButton,
                                              (KeyboardModifiers)0x0,pos_03,0x14);
                            iVar9 = (this->m_delta).xp + iVar1;
                            iVar10 = (this->m_delta).yp + iVar11;
                            local_138 = (double)iVar9;
                            local_130.d = (DateTimePickerPrivate *)(double)iVar10;
                            local_118 = CONCAT44(iVar10,iVar9);
                            uVar8 = QWidget::mapToGlobal((QPoint *)(this->m_dt).value);
                            local_128 = (double)(int)uVar8;
                            local_120 = (double)(int)((ulong)uVar8 >> 0x20);
                            local_158._0_8_ = (QArrayData *)0x0;
                            local_158._8_8_ = (char16_t *)0x0;
                            local_148 = 0;
                            uVar8 = QPointingDevice::primaryPointingDevice((QString *)local_158);
                            QMouseEvent::QMouseEvent(&me,5,&local_138,&local_128,1,1,0,uVar8);
                            if ((QArrayData *)local_158._0_8_ != (QArrayData *)0x0) {
                              LOCK();
                              (((QBasicAtomicInt *)local_158._0_8_)->_q_value).
                              super___atomic_base<int>._M_i =
                                   (((QBasicAtomicInt *)local_158._0_8_)->_q_value).
                                   super___atomic_base<int>._M_i + -1;
                              UNLOCK();
                              if ((((QBasicAtomicInt *)local_158._0_8_)->_q_value).
                                  super___atomic_base<int>._M_i == 0) {
                                QArrayData::deallocate((QArrayData *)local_158._0_8_,2,8);
                              }
                            }
                            QCoreApplication::sendEvent((QObject *)(this->m_dt).value,(QEvent *)&me)
                            ;
                            QTest::qWait(500);
                            pos_09.xp = iVar1 + (this->m_delta).xp;
                            pos_09.yp = iVar11 + (this->m_delta).yp;
                            QTest::mouseEvent(MouseRelease,&((this->m_dt).value)->super_QWidget,
                                              LeftButton,(KeyboardModifiers)0x0,pos_09,0x14);
                            QTest::qWait(500);
                            QtMWidgets::DateTimePicker::dateTime((DateTimePicker *)local_158);
                            QDate::QDate(&local_80,0x7e5,0xb,0x19);
                            QTime::QTime(&local_b0,0xe,0xd,0,0);
                            QDateTime::QDateTime
                                      ((QDateTime *)&local_138,local_80,local_b0,LocalTime,0);
                            bVar4 = (bool)QDateTime::equals((QDateTime *)local_158);
                            cVar5 = QTest::qVerify(bVar4,
                                                  "m_dt->dateTime() == QDateTime( { 2021, 11, 25 }, { 14, 13 } )"
                                                  ,"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                                                  ,0xf3);
                            QDateTime::~QDateTime((QDateTime *)&local_138);
                            QDateTime::~QDateTime((QDateTime *)local_158);
                            QMouseEvent::~QMouseEvent(&me);
                            if (cVar5 != '\0') {
                              pTVar2 = (this->m_dt).value;
                              iVar1 = (this->m_dtSections).d.ptr[5];
                              lVar3 = *(long *)&pTVar2->field_0x20;
                              iVar9 = *(int *)(lVar3 + 0x20) - *(int *)(lVar3 + 0x18);
                              iVar11 = (iVar9 - (iVar9 + 1 >> 0x1f)) + 1 >> 1;
                              pos_04.yp = iVar11;
                              pos_04.xp = iVar1;
                              QTest::mouseEvent(MousePress,&pTVar2->super_QWidget,LeftButton,
                                                (KeyboardModifiers)0x0,pos_04,0x14);
                              iVar9 = iVar1 - (this->m_delta).xp;
                              iVar10 = iVar11 - (this->m_delta).yp;
                              local_138 = (double)iVar9;
                              local_130.d = (DateTimePickerPrivate *)(double)iVar10;
                              local_118 = CONCAT44(iVar10,iVar9);
                              uVar8 = QWidget::mapToGlobal((QPoint *)(this->m_dt).value);
                              local_128 = (double)(int)uVar8;
                              local_120 = (double)(int)((ulong)uVar8 >> 0x20);
                              local_158._0_8_ = (QArrayData *)0x0;
                              local_158._8_8_ = (char16_t *)0x0;
                              local_148 = 0;
                              uVar8 = QPointingDevice::primaryPointingDevice((QString *)local_158);
                              QMouseEvent::QMouseEvent(&me,5,&local_138,&local_128,1,1,0,uVar8);
                              if ((QArrayData *)local_158._0_8_ != (QArrayData *)0x0) {
                                LOCK();
                                (((QBasicAtomicInt *)local_158._0_8_)->_q_value).
                                super___atomic_base<int>._M_i =
                                     (((QBasicAtomicInt *)local_158._0_8_)->_q_value).
                                     super___atomic_base<int>._M_i + -1;
                                UNLOCK();
                                if ((((QBasicAtomicInt *)local_158._0_8_)->_q_value).
                                    super___atomic_base<int>._M_i == 0) {
                                  QArrayData::deallocate((QArrayData *)local_158._0_8_,2,8);
                                }
                              }
                              QCoreApplication::sendEvent
                                        ((QObject *)(this->m_dt).value,(QEvent *)&me);
                              QTest::qWait(500);
                              pos_10.xp = iVar1 - (this->m_delta).xp;
                              pos_10.yp = iVar11 - (this->m_delta).yp;
                              QTest::mouseEvent(MouseRelease,&((this->m_dt).value)->super_QWidget,
                                                LeftButton,(KeyboardModifiers)0x0,pos_10,0x14);
                              QTest::qWait(500);
                              QtMWidgets::DateTimePicker::dateTime((DateTimePicker *)local_158);
                              QDate::QDate(&local_88,0x7e5,0xb,0x19);
                              QTime::QTime(&local_b4,2,0xd,0,0);
                              QDateTime::QDateTime
                                        ((QDateTime *)&local_138,local_88,local_b4,LocalTime,0);
                              bVar4 = (bool)QDateTime::equals((QDateTime *)local_158);
                              cVar5 = QTest::qVerify(bVar4,
                                                  "m_dt->dateTime() == QDateTime( { 2021, 11, 25 }, { 2, 13 } )"
                                                  ,"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/datetime/main.cpp"
                                                  ,0x102);
                              QDateTime::~QDateTime((QDateTime *)&local_138);
                              QDateTime::~QDateTime((QDateTime *)local_158);
                              QMouseEvent::~QMouseEvent(&me);
                              if (cVar5 != '\0') {
                                QWidget::hide();
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      QDateTime::~QDateTime(&dt);
    }
  }
  return;
}

Assistant:

void testDateTime()
	{
		m_dt->show();

		QVERIFY( QTest::qWaitForWindowActive( m_dt.data() ) );

		QVERIFY( m_dt->dateTime() == QDateTime( DATETIMEPICKER_DATE_INITIAL,
			DATETIMEPICKER_TIME_MIN ) );

		const QDateTime dt = { { 2020, 10, 24 }, { 13, 12 } };
		m_dt->setDateTime( dt );

		QVERIFY( m_dt->minimumDate() == DATETIMEPICKER_COMPAT_DATE_MIN );
		QVERIFY( m_dt->maximumDate() == DATETIMEPICKER_DATE_MAX );
		QVERIFY( m_dt->minimumTime() == DATETIMEPICKER_TIME_MIN );
		QVERIFY( m_dt->maximumTime() == DATETIMEPICKER_TIME_MAX );
		QVERIFY( m_dt->minimumDateTime() == DATETIMEPICKER_COMPAT_DATETIME_MIN );
		QVERIFY( m_dt->maximumDateTime() == DATETIMEPICKER_DATETIME_MAX );

		QVERIFY( m_dt->dateTime() == dt );

		m_dt->update();

		QTest::qWait( 500 );

		{
			QPoint p( m_dtSections.at( 0 ), m_dt->height() / 2 );
			QTest::mousePress( m_dt.data(), Qt::LeftButton, {}, p, 20 );
			QMouseEvent me( QEvent::MouseMove, p + m_delta,
				m_dt->mapToGlobal( p + m_delta ),
				Qt::LeftButton, Qt::LeftButton, {} );
			QApplication::sendEvent( m_dt.data(), &me );
			QTest::qWait( 500 );
			QTest::mouseRelease( m_dt.data(), Qt::LeftButton, {}, p + m_delta, 20 );
			QTest::qWait( 500 );

			QVERIFY( m_dt->dateTime() == QDateTime( { 2020, 10, 25 }, { 13, 12 } ) );
		}

		{
			QPoint p( m_dtSections.at( 1 ), m_dt->height() / 2 );
			QTest::mousePress( m_dt.data(), Qt::LeftButton, {}, p, 20 );
			QMouseEvent me( QEvent::MouseMove, p + m_delta,
				m_dt->mapToGlobal( p + m_delta ),
				Qt::LeftButton, Qt::LeftButton, {} );
			QApplication::sendEvent( m_dt.data(), &me );
			QTest::qWait( 500 );
			QTest::mouseRelease( m_dt.data(), Qt::LeftButton, {}, p + m_delta, 20 );
			QTest::qWait( 500 );

			QVERIFY( m_dt->dateTime() == QDateTime( { 2020, 11, 25 }, { 13, 12 } ) );
		}

		{
			QPoint p( m_dtSections.at( 2 ), m_dt->height() / 2 );
			QTest::mousePress( m_dt.data(), Qt::LeftButton, {}, p, 20 );
			QMouseEvent me( QEvent::MouseMove, p + m_delta,
				m_dt->mapToGlobal( p + m_delta ),
				Qt::LeftButton, Qt::LeftButton, {} );
			QApplication::sendEvent( m_dt.data(), &me );
			QTest::qWait( 500 );
			QTest::mouseRelease( m_dt.data(), Qt::LeftButton, {}, p + m_delta, 20 );

			QTest::qWait( 500 );

			QVERIFY( m_dt->dateTime() == QDateTime( { 2021, 11, 25 }, { 13, 12 } ) );
		}

		{
			QPoint p( m_dtSections.at( 3 ), m_dt->height() / 2 );
			QTest::mousePress( m_dt.data(), Qt::LeftButton, {}, p, 20 );
			QMouseEvent me( QEvent::MouseMove, p + m_delta,
				m_dt->mapToGlobal( p + m_delta ),
				Qt::LeftButton, Qt::LeftButton, {} );
			QApplication::sendEvent( m_dt.data(), &me );
			QTest::qWait( 500 );
			QTest::mouseRelease( m_dt.data(), Qt::LeftButton, {}, p + m_delta, 20 );

			QTest::qWait( 500 );

			QVERIFY( m_dt->dateTime() == QDateTime( { 2021, 11, 25 }, { 14, 12 } ) );
		}

		{
			QPoint p( m_dtSections.at( 4 ), m_dt->height() / 2 );
			QTest::mousePress( m_dt.data(), Qt::LeftButton, {}, p, 20 );
			QMouseEvent me( QEvent::MouseMove, p + m_delta,
				m_dt->mapToGlobal( p + m_delta ),
				Qt::LeftButton, Qt::LeftButton, {} );
			QApplication::sendEvent( m_dt.data(), &me );
			QTest::qWait( 500 );
			QTest::mouseRelease( m_dt.data(), Qt::LeftButton, {}, p + m_delta, 20 );

			QTest::qWait( 500 );

			QVERIFY( m_dt->dateTime() == QDateTime( { 2021, 11, 25 }, { 14, 13 } ) );
		}

		{
			QPoint p( m_dtSections.at( 5 ), m_dt->height() / 2 );
			QTest::mousePress( m_dt.data(), Qt::LeftButton, {}, p, 20 );
			QMouseEvent me( QEvent::MouseMove, p - m_delta,
				m_dt->mapToGlobal( p - m_delta ),
				Qt::LeftButton, Qt::LeftButton, {} );
			QApplication::sendEvent( m_dt.data(), &me );
			QTest::qWait( 500 );
			QTest::mouseRelease( m_dt.data(), Qt::LeftButton, {}, p - m_delta, 20 );

			QTest::qWait( 500 );

			QVERIFY( m_dt->dateTime() == QDateTime( { 2021, 11, 25 }, { 2, 13 } ) );
		}

		m_dt->hide();
	}